

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-utf8.c
# Opt level: O2

void test_bson_utf8_nil(void)

{
  char cVar1;
  int iVar2;
  byte *__s2;
  uint uVar3;
  char *pcVar4;
  undefined8 uStack_10;
  
  cVar1 = bson_utf8_validate("a",3,1);
  if (cVar1 == '\0') {
    pcVar4 = "bson_utf8_validate ((const char *) test, 3, true)";
    uStack_10 = 0x5b;
LAB_0012c01b:
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            uStack_10,"test_bson_utf8_nil",pcVar4);
    abort();
  }
  cVar1 = bson_utf8_validate("a",3,0);
  if (cVar1 != '\0') {
    pcVar4 = "!bson_utf8_validate ((const char *) test, 3, false)";
    uStack_10 = 0x5c;
    goto LAB_0012c01b;
  }
  __s2 = (byte *)bson_utf8_escape_for_json("a",0xffffffffffffffff);
  if (__s2 != (byte *)0x14463a) {
    uVar3 = *__s2 - 0x61;
    if (uVar3 == 0) {
      uVar3 = (uint)__s2[1];
    }
    if (uVar3 != 0) {
      pcVar4 = "a";
      goto LAB_0012c060;
    }
  }
  bson_free(__s2);
  __s2 = (byte *)bson_utf8_escape_for_json("a",3);
  if (__s2 != (byte *)"a\\u0000b") {
    iVar2 = strcmp("a\\u0000b",(char *)__s2);
    if (iVar2 != 0) {
      pcVar4 = "a\\u0000b";
LAB_0012c060:
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",pcVar4,__s2);
      abort();
    }
  }
  bson_free(__s2);
  return;
}

Assistant:

static void
test_bson_utf8_nil (void)
{
   static const unsigned char test[] = {'a', 0, 'b', 0};
   char *str;

   BSON_ASSERT (bson_utf8_validate ((const char *) test, 3, true));
   BSON_ASSERT (!bson_utf8_validate ((const char *) test, 3, false));

   /* no length provided, stop at first nil */
   str = bson_utf8_escape_for_json ((const char *) test, -1);
   ASSERT_CMPSTR ("a", str);
   bson_free (str);

   str = bson_utf8_escape_for_json ((const char *) test, 3);
   ASSERT_CMPSTR ("a\\u0000b", str);
   bson_free (str);
}